

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall wallet::LegacyDataSPKM::GetKey(LegacyDataSPKM *this,CKeyID *address,CKey *keyOut)

{
  WalletStorage *pWVar1;
  undefined1 uVar2;
  int iVar3;
  const_iterator cVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  long *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  iVar3 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[9])();
  if ((char)iVar3 == '\0') {
    uVar2 = FillableSigningProvider::GetKey(&this->super_FillableSigningProvider,address,keyOut);
  }
  else {
    cVar4 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::find(&(this->mapCryptedKeys)._M_t,address);
    if ((_Rb_tree_header *)cVar4._M_node ==
        &(this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header) {
      uVar2 = 0;
    }
    else {
      pWVar1 = (this->super_ScriptPubKeyMan).m_storage;
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58 = (long *)0x0;
      uStack_50 = 0;
      local_58 = (long *)operator_new(0x18);
      *local_58 = (long)(cVar4._M_node + 4);
      local_58[1] = (long)&cVar4._M_node[1]._M_right;
      local_58[2] = (long)keyOut;
      pcStack_40 = std::
                   _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp:1025:44)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp:1025:44)>
                 ::_M_manager;
      iVar3 = (*pWVar1->_vptr_WalletStorage[8])(pWVar1);
      uVar2 = (undefined1)iVar3;
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::GetKey(const CKeyID &address, CKey& keyOut) const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        return FillableSigningProvider::GetKey(address, keyOut);
    }

    CryptedKeyMap::const_iterator mi = mapCryptedKeys.find(address);
    if (mi != mapCryptedKeys.end())
    {
        const CPubKey &vchPubKey = (*mi).second.first;
        const std::vector<unsigned char> &vchCryptedSecret = (*mi).second.second;
        return m_storage.WithEncryptionKey([&](const CKeyingMaterial& encryption_key) {
            return DecryptKey(encryption_key, vchCryptedSecret, vchPubKey, keyOut);
        });
    }
    return false;
}